

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O2

Rect __thiscall SkylineBinPack::InsertMinWaste(SkylineBinPack *this,int width,int height)

{
  bool bVar1;
  Rect RVar2;
  Rect newNode;
  int bestIndex;
  int bestWastedArea;
  int bestHeight;
  Rect local_50;
  int local_3c;
  int local_38;
  int local_34;
  
  local_50 = FindPositionForNewNodeMinWaste(this,width,height,&local_34,&local_38,&local_3c);
  if (local_3c == -1) {
    local_50.width = 0;
    local_50.height = 0;
    local_50.x = 0;
    local_50.y = 0;
  }
  else {
    bVar1 = DisjointRectCollection::Disjoint(&this->disjointRects,&local_50);
    if (!bVar1) {
      __assert_fail("disjointRects.Disjoint(newNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                    ,0x159,"Rect SkylineBinPack::InsertMinWaste(int, int)");
    }
    AddSkylineLevel(this,local_3c,&local_50);
    this->usedSurfaceArea = this->usedSurfaceArea + (long)(height * width);
    DisjointRectCollection::Add(&this->disjointRects,&local_50);
  }
  RVar2.width = local_50.width;
  RVar2.height = local_50.height;
  RVar2.x = local_50.x;
  RVar2.y = local_50.y;
  return RVar2;
}

Assistant:

Rect SkylineBinPack::InsertMinWaste(int width, int height)
{
	int bestHeight;
	int bestWastedArea;
	int bestIndex;
	Rect newNode = FindPositionForNewNodeMinWaste(width, height, bestHeight, bestWastedArea, bestIndex);

	if (bestIndex != -1)
	{
#ifdef _DEBUG
		assert(disjointRects.Disjoint(newNode));
#endif
		// Perform the actual packing.
		AddSkylineLevel(bestIndex, newNode);

		usedSurfaceArea += width * height;
#ifdef _DEBUG
		disjointRects.Add(newNode);
#endif
	}
	else
		memset(&newNode, 0, sizeof(newNode));

	return newNode;
}